

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetFunctionContextTypeName(ExpressionContext *ctx,InplaceStr functionName,uint index)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  size_t sVar4;
  char *unaff_R13;
  ulong uVar5;
  char *unaff_R14;
  ulong uVar6;
  InplaceStr IVar7;
  InplaceStr IVar8;
  
  bVar1 = *functionName.begin;
  if ((((char)bVar1 < 'A' && bVar1 != 0x24) ||
      ((bVar1 - 0x5e < 0x21 && ((0x140000001U >> ((ulong)(bVar1 - 0x5e) & 0x3f) & 1) != 0)))) &&
     (IVar7.end = unaff_R14, IVar7.begin = unaff_R13, IVar7 = GetOperatorName(IVar7),
     IVar7.begin != IVar7.end)) {
    functionName = IVar7;
  }
  uVar6 = (long)functionName.end - (long)functionName.begin;
  uVar5 = (ulong)((int)uVar6 + 0x21);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar5);
  IVar8.begin = (char *)CONCAT44(extraout_var,iVar2);
  IVar8.begin[0] = '_';
  IVar8.begin[1] = '_';
  uVar6 = uVar6 & 0xffffffff;
  memcpy(IVar8.begin + 2,functionName.begin,uVar6);
  IVar8.begin[uVar6 + 2] = '_';
  pcVar3 = NameWriteUnsigned(IVar8.begin + uVar6 + 3,index);
  builtin_strncpy(pcVar3,"_cls",5);
  sVar4 = strlen(IVar8.begin);
  if (uVar5 <= sVar4) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x18e,
                  "InplaceStr GetFunctionContextTypeName(ExpressionContext &, InplaceStr, unsigned int)"
                 );
  }
  IVar8.end = IVar8.begin + sVar4;
  return IVar8;
}

Assistant:

InplaceStr GetFunctionContextTypeName(ExpressionContext &ctx, InplaceStr functionName, unsigned index)
{
	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '_';
	*pos++ = '_';

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, index);

	strcpy(pos, "_cls");
	pos += strlen("_cls");

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}